

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

void test_handshake(ptls_iovec_t ticket,int mode,int expect_ticket,int check_ch,
                   int require_client_authentication)

{
  char *pcVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  ptls_context_t *ppVar17;
  int iVar18;
  int iVar19;
  ptls_t *ppVar20;
  ptls_t *ppVar21;
  undefined8 uVar22;
  uint uVar23;
  size_t sVar24;
  ulong uVar25;
  size_t sVar26;
  bool bVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  size_t consumed;
  ptls_buffer_t cbuf;
  ptls_buffer_t decbuf;
  size_t max_early_data_size;
  ptls_handshake_properties_t server_hs_prop;
  uint8_t decbuf_small [16384];
  uint8_t sbuf_small [16384];
  uint8_t cbuf_small [16384];
  size_t local_c1d8;
  int local_c1d0;
  int local_c1cc;
  undefined1 local_c1c8 [16];
  undefined1 local_c1b8 [16];
  undefined1 local_c1a8 [16];
  undefined1 local_c198 [16];
  ptls_t *local_c180;
  ptls_t *local_c178;
  ulong local_c170;
  undefined1 local_c168 [16];
  undefined1 local_c158 [16];
  int local_c144;
  ulong local_c140;
  undefined1 local_c138 [44];
  byte bStack_c10c;
  undefined3 uStack_c10b;
  char *local_c108;
  size_t sStack_c100;
  undefined1 local_c0f8 [16];
  uint8_t *local_c0e8;
  size_t sStack_c0e0;
  undefined1 local_c0d8 [16];
  undefined1 local_c0c8 [16];
  undefined1 local_c0b8 [96];
  undefined1 local_c058 [16];
  undefined1 local_c048 [16];
  undefined1 local_c038 [16384];
  undefined1 local_8038 [16384];
  undefined1 local_4038 [16392];
  
  ppVar17 = ctx;
  local_c158._12_4_ = SUB84(local_c158._0_8_,4);
  local_c198._12_4_ = SUB84(local_c198._0_8_,4);
  local_c1b8._12_4_ = SUB84(local_c1b8._0_8_,4);
  uVar25 = (ulong)(uint)mode;
  local_c0c8 = (undefined1  [16])0x0;
  local_c0d8 = (undefined1  [16])0x0;
  local_c0e8 = (uint8_t *)0x0;
  sStack_c0e0 = 0;
  local_c0f8 = (undefined1  [16])0x0;
  local_c108 = (char *)0x0;
  sStack_c100 = 0;
  stack0xffffffffffff3ee8 = (undefined1  [16])0x0;
  local_c138._0_8_ = (ptls_iovec_t *)0x0;
  local_c138._8_8_ = 0;
  local_c048 = (undefined1  [16])0x0;
  local_c058 = (undefined1  [16])0x0;
  local_c0b8._80_8_ = (uint8_t *)0x0;
  local_c0b8._88_8_ = 0;
  local_c0b8._64_16_ = (undefined1  [16])0x0;
  local_c0b8._48_8_ = (uint8_t *)0x0;
  local_c0b8._56_8_ = 0;
  local_c0b8._32_16_ = (undefined1  [16])0x0;
  local_c0b8._16_8_ = (uint8_t *)0x0;
  local_c0b8._24_8_ = 0;
  local_c0b8._0_8_ = (ptls_iovec_t *)0x0;
  local_c0b8._8_8_ = 0;
  local_c140 = 0;
  if (check_ch != 0) {
    ctx->verify_certificate = verify_certificate;
  }
  local_c1cc = check_ch;
  local_c138._16_16_ = (undefined1  [16])ticket;
  ppVar20 = ptls_client_new(ppVar17);
  ppVar21 = new_instance(ctx_peer,1);
  ppVar21->state = PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO;
  (ppVar21->field_18).server.early_data_skipped_bytes = 0xffffffff;
  local_c1c8._8_8_ = 0x4000;
  local_c1c8._0_8_ = local_4038;
  local_c1b8._0_12_ = ZEXT812(0);
  local_c1a8._8_8_ = 0x4000;
  local_c1a8._0_8_ = local_8038;
  local_c198._0_12_ = ZEXT812(0);
  local_c168._8_8_ = 0x4000;
  local_c168._0_8_ = local_c038;
  local_c158._0_12_ = ZEXT812(0);
  if (local_c1cc != 0) {
    ctx_peer->on_client_hello = &test_handshake::cb;
    local_c138._8_8_ = 2;
    local_c138._0_8_ = test_handshake::protocols;
    ptls_set_server_name(ppVar20,"test.example.com",0);
  }
  ppVar17 = ctx_peer;
  ctx_peer->on_extension = &test_handshake::cb_1;
  if (require_client_authentication != 0) {
    ppVar17->field_0x70 = ppVar17->field_0x70 | 8;
  }
  if (ppVar17->esni != (ptls_esni_context_t **)0x0) {
    was_esni = 0;
    sStack_c100 = 0x72;
    local_c108 = anon_var_dwarf_d004;
  }
  local_c144 = expect_ticket;
  if (mode == 4) {
    if (ppVar17->max_early_data_size == 0) {
      __assert_fail("ctx_peer->max_early_data_size != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c"
                    ,0x264,"void test_handshake(ptls_iovec_t, int, int, int, int)");
    }
    local_c138._32_8_ = &local_c140;
  }
  else if (mode == 3) {
    bStack_c10c = bStack_c10c | 1;
    local_c0b8._72_8_ = "0123456789abcdef0123456789abcdef0123456789abcdef";
    local_c058[0] = local_c058[0] | 2;
  }
  else if (mode == 2) {
    bStack_c10c = bStack_c10c | 1;
  }
  local_c180 = ppVar20;
  iVar18 = ptls_handshake(ppVar20,(ptls_buffer_t *)local_c1c8,(void *)0x0,(size_t *)0x0,
                          (ptls_handshake_properties_t *)local_c138);
  _ok((uint)(iVar18 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x26a)
  ;
  _ok((uint)(local_c1b8._0_8_ != 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x26b)
  ;
  local_c1d0 = require_client_authentication;
  local_c170 = uVar25;
  if (mode - 1U < 3) {
    local_c1d8 = local_c1b8._0_8_;
    iVar18 = ptls_handshake(ppVar21,(ptls_buffer_t *)local_c1a8,(void *)local_c1c8._0_8_,&local_c1d8
                            ,(ptls_handshake_properties_t *)local_c0b8);
    if (mode == 3) {
      _ok((uint)(iVar18 == 0x206),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
          0x274);
      ptls_free(ppVar21);
      ppVar21 = new_instance(ctx_peer,1);
      ppVar21->state = PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO;
      (ppVar21->field_18).server.early_data_skipped_bytes = 0xffffffff;
    }
    else {
      _ok((uint)(iVar18 == 0x202),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
          0x278);
    }
    _ok((uint)(local_c1b8._0_8_ == local_c1d8),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x27a);
    _ok((uint)(local_c198._0_8_ != 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x27b);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_c1b8._8_8_;
    local_c1b8 = auVar2 << 0x40;
    local_c1d8 = local_c198._0_8_;
    iVar18 = ptls_handshake(local_c180,(ptls_buffer_t *)local_c1c8,(void *)local_c1a8._0_8_,
                            &local_c1d8,(ptls_handshake_properties_t *)local_c138);
    _ok((uint)(iVar18 == 0x202),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x27f);
    _ok((uint)(local_c198._0_8_ == local_c1d8),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x280);
    _ok((uint)(local_c1b8._0_8_ != 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x281);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_c198._8_8_;
    local_c198 = auVar3 << 0x40;
    mode = (int)local_c170;
    require_client_authentication = local_c1d0;
  }
  else if (mode == 4) {
    _ok((uint)(local_c140 == ctx_peer->max_early_data_size),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x285);
    iVar18 = ptls_send(local_c180,(ptls_buffer_t *)local_c1c8,"GET / HTTP/1.0\r\n\r\n",0x12);
    _ok((uint)(iVar18 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x287);
  }
  local_c1d8 = local_c1b8._0_8_;
  iVar18 = ptls_handshake(ppVar21,(ptls_buffer_t *)local_c1a8,(void *)local_c1c8._0_8_,&local_c1d8,
                          (ptls_handshake_properties_t *)local_c0b8);
  if (require_client_authentication == 1) {
    _ok((uint)((ppVar21->field_0x160 & 2) == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x28f);
    uVar22 = 0x290;
    iVar19 = 0x202;
  }
  else {
    uVar22 = 0x292;
    iVar19 = 0;
  }
  uVar23 = 0;
  _ok((uint)(iVar18 == iVar19),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",uVar22
     );
  _ok((uint)(local_c198._0_8_ != 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x295)
  ;
  if (local_c1cc == 0) {
    _ok((uint)(ppVar21->server_name == (char *)0x0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x29d);
    bVar27 = ppVar21->negotiated_protocol == (char *)0x0;
    uVar22 = 0x29e;
  }
  else {
    _ok((uint)(ppVar21->server_name != (char *)0x0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x297);
    iVar18 = strcmp(ppVar21->server_name,"test.example.com");
    _ok((uint)(iVar18 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x298);
    _ok((uint)(ppVar21->negotiated_protocol != (char *)0x0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x299);
    pcVar1 = ppVar21->negotiated_protocol;
    if ((*pcVar1 == 'h') && (pcVar1[1] == '2')) {
      uVar23 = (uint)(pcVar1[2] == '\0');
    }
    _ok(uVar23,"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x29a);
    bVar27 = was_esni == (uint)(ctx_peer->esni != (ptls_esni_context_t **)0x0);
    uVar22 = 0x29b;
  }
  _ok((uint)bVar27,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",uVar22
     );
  sVar26 = local_c1d8;
  local_c178 = ppVar21;
  if (mode == 4 && require_client_authentication == 0) {
    _ok((uint)(local_c1d8 < (ulong)local_c1b8._0_8_),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x2a2);
    memmove((void *)local_c1c8._0_8_,(uint8_t *)(local_c1c8._0_8_ + sVar26),
            local_c1b8._0_8_ - sVar26);
    local_c1d8 = local_c1b8._0_8_ - sVar26;
    local_c1b8._0_8_ = local_c1d8;
    iVar18 = ptls_receive(ppVar21,(ptls_buffer_t *)local_c168,(void *)local_c1c8._0_8_,&local_c1d8);
    _ok((uint)(iVar18 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x2a8);
    _ok((uint)(local_c1d8 == local_c1b8._0_8_),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x2a9);
    uVar22 = local_c158._0_8_;
    _ok((uint)(local_c158._0_8_ == 0x12),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x2aa);
    iVar18 = bcmp((void *)local_c168._0_8_,"GET / HTTP/1.0\r\n\r\n",uVar22);
    _ok((uint)(iVar18 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x2ab);
    _ok((uint)(ppVar21->state < PTLS_STATE_CLIENT_POST_HANDSHAKE),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x2ac);
    require_client_authentication = local_c1d0;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = local_c1b8._8_8_;
    local_c1b8 = auVar15 << 0x40;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_c158._8_8_;
    local_c158 = auVar4 << 0x40;
    iVar18 = ptls_send(ppVar21,(ptls_buffer_t *)local_c1a8,"HTTP/1.0 200 OK\r\n\r\nhello world\n",
                       0x1f);
    _ok((uint)(iVar18 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x2b1);
  }
  else {
    _ok((uint)(local_c1d8 == local_c1b8._0_8_),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x2b3);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_c1b8._8_8_;
    local_c1b8 = auVar5 << 0x40;
  }
  ppVar20 = local_c180;
  local_c1d8 = local_c198._0_8_;
  uVar23 = 0;
  iVar18 = ptls_handshake(local_c180,(ptls_buffer_t *)local_c1c8,(void *)local_c1a8._0_8_,
                          &local_c1d8,(ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar18 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x2b9)
  ;
  _ok((uint)(local_c1b8._0_8_ != 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x2ba)
  ;
  ppVar21 = local_c178;
  if (local_c1cc == 0) {
    _ok((uint)(local_c178->server_name == (char *)0x0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x2c1);
    _ok((uint)(ppVar21->negotiated_protocol == (char *)0x0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x2c2);
    iVar18 = (int)local_c170;
  }
  else {
    _ok((uint)(ppVar20->server_name != (char *)0x0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",700)
    ;
    iVar18 = strcmp(ppVar20->server_name,"test.example.com");
    _ok((uint)(iVar18 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x2bd);
    _ok((uint)(ppVar20->negotiated_protocol != (char *)0x0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x2be);
    pcVar1 = ppVar20->negotiated_protocol;
    iVar18 = (int)local_c170;
    if ((*pcVar1 == 'h') && (pcVar1[1] == '2')) {
      uVar23 = (uint)(pcVar1[2] == '\0');
    }
    _ok(uVar23,"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x2bf);
  }
  sVar26 = local_c1d8;
  if (local_c144 == 0) {
    sVar26 = 0;
    _ok((uint)(local_c1d8 == local_c198._0_8_),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x2ca);
  }
  else {
    _ok((uint)(local_c1d8 < (ulong)local_c198._0_8_),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x2c6);
    memmove((void *)local_c1a8._0_8_,(uint8_t *)(local_c1a8._0_8_ + sVar26),
            local_c198._0_8_ - sVar26);
    sVar26 = local_c198._0_8_ - sVar26;
  }
  ppVar21 = local_c178;
  local_c198._0_8_ = sVar26;
  if (require_client_authentication == 1) {
    _ok((uint)(local_c178->state < PTLS_STATE_CLIENT_POST_HANDSHAKE),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x2cf);
    local_c1d8 = local_c1b8._0_8_;
    iVar18 = ptls_handshake(ppVar21,(ptls_buffer_t *)local_c1a8,(void *)local_c1c8._0_8_,&local_c1d8
                            ,(ptls_handshake_properties_t *)local_c0b8);
    _ok((uint)(iVar18 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x2d2);
    _ok((uint)(PTLS_STATE_SERVER_EXPECT_FINISHED < ppVar21->state),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x2d3);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_c1b8._8_8_;
    local_c1b8 = auVar6 << 0x40;
  }
  else if (iVar18 == 4) goto LAB_0011fec1;
  iVar18 = ptls_send(ppVar20,(ptls_buffer_t *)local_c1c8,"GET / HTTP/1.0\r\n\r\n",0x12);
  _ok((uint)(iVar18 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x2d9)
  ;
  local_c1d8 = local_c1b8._0_8_;
  iVar18 = ptls_receive(ppVar21,(ptls_buffer_t *)local_c168,(void *)local_c1c8._0_8_,&local_c1d8);
  _ok((uint)(iVar18 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x2dd)
  ;
  _ok((uint)(local_c1d8 == local_c1b8._0_8_),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x2de)
  ;
  _ok((uint)(local_c158._0_8_ == 0x12),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x2df)
  ;
  auVar28[0] = -(*(uint8_t *)local_c168._0_8_ == 'G');
  auVar28[1] = -(*(uint8_t *)(local_c168._0_8_ + 1) == 'E');
  auVar28[2] = -(*(uint8_t *)(local_c168._0_8_ + 2) == 'T');
  auVar28[3] = -(*(uint8_t *)(local_c168._0_8_ + 3) == ' ');
  auVar28[4] = -(*(uint8_t *)(local_c168._0_8_ + 4) == '/');
  auVar28[5] = -(*(uint8_t *)(local_c168._0_8_ + 5) == ' ');
  auVar28[6] = -(*(uint8_t *)(local_c168._0_8_ + 6) == 'H');
  auVar28[7] = -(*(uint8_t *)(local_c168._0_8_ + 7) == 'T');
  auVar28[8] = -(*(uint8_t *)(local_c168._0_8_ + 8) == 'T');
  auVar28[9] = -(*(uint8_t *)(local_c168._0_8_ + 9) == 'P');
  auVar28[10] = -(*(uint8_t *)(local_c168._0_8_ + 10) == '/');
  auVar28[0xb] = -(*(uint8_t *)(local_c168._0_8_ + 0xb) == '1');
  auVar28[0xc] = -(*(uint8_t *)(local_c168._0_8_ + 0xc) == '.');
  auVar28[0xd] = -(*(uint8_t *)(local_c168._0_8_ + 0xd) == '0');
  auVar28[0xe] = -(*(uint8_t *)(local_c168._0_8_ + 0xe) == '\r');
  auVar28[0xf] = -(*(uint8_t *)(local_c168._0_8_ + 0xf) == '\n');
  auVar30[0] = -((char)*(undefined2 *)(local_c168._0_8_ + 0x10) == '\r');
  auVar30[1] = -((char)((ushort)*(undefined2 *)(local_c168._0_8_ + 0x10) >> 8) == '\n');
  auVar30[2] = 0xff;
  auVar30[3] = 0xff;
  auVar30[4] = 0xff;
  auVar30[5] = 0xff;
  auVar30[6] = 0xff;
  auVar30[7] = 0xff;
  auVar30[8] = 0xff;
  auVar30[9] = 0xff;
  auVar30[10] = 0xff;
  auVar30[0xb] = 0xff;
  auVar30[0xc] = 0xff;
  auVar30[0xd] = 0xff;
  auVar30[0xe] = 0xff;
  auVar30[0xf] = 0xff;
  auVar30 = auVar30 & auVar28;
  _ok((uint)((ushort)((ushort)(SUB161(auVar30 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe |
                     (ushort)(byte)(auVar30[0xf] >> 7) << 0xf) == 0xffff),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x2e0)
  ;
  _ok((uint)(PTLS_STATE_SERVER_EXPECT_FINISHED < ppVar21->state),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x2e1)
  ;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_c158._8_8_;
  local_c158 = auVar7 << 0x40;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_c1b8._8_8_;
  local_c1b8 = auVar8 << 0x40;
  iVar18 = ptls_send(ppVar21,(ptls_buffer_t *)local_c1a8,"HTTP/1.0 200 OK\r\n\r\nhello world\n",0x1f
                    );
  ppVar20 = local_c180;
  _ok((uint)(iVar18 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x2e6)
  ;
LAB_0011fec1:
  local_c1d8 = local_c198._0_8_;
  iVar18 = ptls_receive(ppVar20,(ptls_buffer_t *)local_c168,(void *)local_c1a8._0_8_,&local_c1d8);
  _ok((uint)(iVar18 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x2eb)
  ;
  _ok((uint)(local_c1d8 == local_c198._0_8_),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x2ec)
  ;
  _ok((uint)(local_c158._0_8_ == 0x1f),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x2ed)
  ;
  auVar29[0] = -(*(uint8_t *)(local_c168._0_8_ + 0xf) == '\r');
  auVar29[1] = -(*(uint8_t *)(local_c168._0_8_ + 0x10) == '\n');
  auVar29[2] = -(*(uint8_t *)(local_c168._0_8_ + 0x11) == '\r');
  auVar29[3] = -(*(uint8_t *)(local_c168._0_8_ + 0x12) == '\n');
  auVar29[4] = -(*(uint8_t *)(local_c168._0_8_ + 0x13) == 'h');
  auVar29[5] = -(*(uint8_t *)(local_c168._0_8_ + 0x14) == 'e');
  auVar29[6] = -(*(uint8_t *)(local_c168._0_8_ + 0x15) == 'l');
  auVar29[7] = -(*(uint8_t *)(local_c168._0_8_ + 0x16) == 'l');
  auVar29[8] = -(*(uint8_t *)(local_c168._0_8_ + 0x17) == 'o');
  auVar29[9] = -(*(uint8_t *)(local_c168._0_8_ + 0x18) == ' ');
  auVar29[10] = -(*(uint8_t *)(local_c168._0_8_ + 0x19) == 'w');
  auVar29[0xb] = -(*(uint8_t *)(local_c168._0_8_ + 0x1a) == 'o');
  auVar29[0xc] = -(*(uint8_t *)(local_c168._0_8_ + 0x1b) == 'r');
  auVar29[0xd] = -(*(uint8_t *)(local_c168._0_8_ + 0x1c) == 'l');
  auVar29[0xe] = -(*(uint8_t *)(local_c168._0_8_ + 0x1d) == 'd');
  auVar29[0xf] = -(*(uint8_t *)(local_c168._0_8_ + 0x1e) == '\n');
  auVar31[0] = -(*(uint8_t *)local_c168._0_8_ == 'H');
  auVar31[1] = -(*(uint8_t *)(local_c168._0_8_ + 1) == 'T');
  auVar31[2] = -(*(uint8_t *)(local_c168._0_8_ + 2) == 'T');
  auVar31[3] = -(*(uint8_t *)(local_c168._0_8_ + 3) == 'P');
  auVar31[4] = -(*(uint8_t *)(local_c168._0_8_ + 4) == '/');
  auVar31[5] = -(*(uint8_t *)(local_c168._0_8_ + 5) == '1');
  auVar31[6] = -(*(uint8_t *)(local_c168._0_8_ + 6) == '.');
  auVar31[7] = -(*(uint8_t *)(local_c168._0_8_ + 7) == '0');
  auVar31[8] = -(*(uint8_t *)(local_c168._0_8_ + 8) == ' ');
  auVar31[9] = -(*(uint8_t *)(local_c168._0_8_ + 9) == '2');
  auVar31[10] = -(*(uint8_t *)(local_c168._0_8_ + 10) == '0');
  auVar31[0xb] = -(*(uint8_t *)(local_c168._0_8_ + 0xb) == '0');
  auVar31[0xc] = -(*(uint8_t *)(local_c168._0_8_ + 0xc) == ' ');
  auVar31[0xd] = -(*(uint8_t *)(local_c168._0_8_ + 0xd) == 'O');
  auVar31[0xe] = -(*(uint8_t *)(local_c168._0_8_ + 0xe) == 'K');
  auVar31[0xf] = -(*(uint8_t *)(local_c168._0_8_ + 0xf) == '\r');
  auVar31 = auVar31 & auVar29;
  _ok((uint)((ushort)((ushort)(SUB161(auVar31 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe |
                     (ushort)(byte)(auVar31[0xf] >> 7) << 0xf) == 0xffff),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x2ee)
  ;
  _ok((uint)(PTLS_STATE_SERVER_EXPECT_FINISHED < ppVar20->state),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x2ef)
  ;
  ppVar21 = local_c178;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_c158._8_8_;
  local_c158 = auVar9 << 0x40;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = local_c198._8_8_;
  local_c198 = auVar16 << 0x40;
  if ((int)local_c170 == 4) {
    local_c1d8 = local_c1b8._0_8_;
    iVar18 = ptls_receive(local_c178,(ptls_buffer_t *)local_c168,(void *)local_c1c8._0_8_,
                          &local_c1d8);
    _ok((uint)(iVar18 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x2f6);
    _ok((uint)(local_c1b8._0_8_ == local_c1d8),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x2f7);
    sVar26 = local_c158._0_8_;
    _ok((uint)(local_c158._0_8_ == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x2f8);
    _ok((uint)(PTLS_STATE_SERVER_EXPECT_FINISHED < ppVar20->state),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x2f9);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = local_c1b8._8_8_;
    local_c1b8 = auVar10 << 0x40;
    sVar24 = 0;
  }
  else if ((int)local_c170 == 5) {
    ptls_update_key(local_c178,1);
    sVar26 = 0;
    _ok(1,"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x300);
    _ok(*(uint *)&ppVar21->field_0x160 >> 3 & 1,"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x301);
    _ok(*(uint *)&ppVar21->field_0x160 >> 4 & 1,"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x302);
    iVar18 = ptls_send(ppVar21,(ptls_buffer_t *)local_c1a8,"good bye",8);
    _ok((uint)(iVar18 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x304);
    _ok((uint)((ppVar21->field_0x160 & 8) == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x305);
    _ok((uint)((ppVar21->field_0x160 & 0x10) == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x306);
    ppVar20 = local_c180;
    local_c1d8 = local_c198._0_8_;
    iVar18 = ptls_receive(local_c180,(ptls_buffer_t *)local_c168,(void *)local_c1a8._0_8_,
                          &local_c1d8);
    _ok((uint)(iVar18 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x309);
    _ok((uint)(local_c198._0_8_ == local_c1d8),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x30a);
    _ok((uint)(local_c158._0_8_ == 8),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x30b);
    _ok((uint)(*(long *)local_c168._0_8_ == 0x65796220646f6f67),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x30c);
    _ok(*(uint *)&ppVar20->field_0x160 >> 3 & 1,"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x30d);
    _ok((uint)((ppVar20->field_0x160 & 0x10) == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x30e);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = local_c198._8_8_;
    local_c198 = auVar11 << 0x40;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = local_c158._8_8_;
    local_c158 = auVar12 << 0x40;
    iVar18 = ptls_send(ppVar20,(ptls_buffer_t *)local_c1c8,"hello",5);
    _ok((uint)(iVar18 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x312);
    local_c1d8 = local_c1b8._0_8_;
    iVar18 = ptls_receive(ppVar21,(ptls_buffer_t *)local_c168,(void *)local_c1c8._0_8_,&local_c1d8);
    _ok((uint)(iVar18 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x315);
    _ok((uint)(local_c1b8._0_8_ == local_c1d8),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x316);
    _ok((uint)(local_c158._0_8_ == 5),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x317);
    _ok((uint)((char)*(int *)(local_c168._0_8_ + 4) == 'o' && *(int *)local_c168._0_8_ == 0x6c6c6568
              ),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x318);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = local_c1b8._8_8_;
    local_c1b8 = auVar13 << 0x40;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = local_c158._8_8_;
    local_c158 = auVar14 << 0x40;
    sVar24 = 0;
  }
  else {
    sVar26 = 0;
    sVar24 = local_c1b8._0_8_;
  }
  iVar18 = local_c1d0;
  (*ptls_clear_memory)((void *)local_c1c8._0_8_,sVar24);
  if (local_c1b8._8_4_ != 0) {
    free((void *)local_c1c8._0_8_);
  }
  local_c1b8 = (undefined1  [16])0x0;
  local_c1c8 = (undefined1  [16])0x0;
  (*ptls_clear_memory)((void *)local_c1a8._0_8_,local_c198._0_8_);
  ppVar21 = local_c178;
  ppVar20 = local_c180;
  if (local_c198._8_4_ != 0) {
    free((void *)local_c1a8._0_8_);
  }
  local_c198 = (undefined1  [16])0x0;
  local_c1a8 = (undefined1  [16])0x0;
  uVar22 = local_c168._0_8_;
  (*ptls_clear_memory)((void *)local_c168._0_8_,sVar26);
  if (local_c158._8_4_ != 0) {
    free((void *)uVar22);
  }
  local_c158 = (undefined1  [16])0x0;
  local_c168 = (undefined1  [16])0x0;
  ptls_free(ppVar20);
  ptls_free(ppVar21);
  if (local_c1cc != 0) {
    ctx_peer->on_client_hello = (ptls_on_client_hello_t *)0x0;
  }
  ctx->verify_certificate = (ptls_verify_certificate_t *)0x0;
  if (iVar18 != 0) {
    ctx_peer->field_0x70 = ctx_peer->field_0x70 & 0xf7;
  }
  return;
}

Assistant:

static void test_handshake(ptls_iovec_t ticket, int mode, int expect_ticket, int check_ch, int require_client_authentication)
{
    ptls_t *client, *server;
    ptls_handshake_properties_t client_hs_prop = {{{{NULL}, ticket}}}, server_hs_prop = {{{{NULL}}}};
    uint8_t cbuf_small[16384], sbuf_small[16384], decbuf_small[16384];
    ptls_buffer_t cbuf, sbuf, decbuf;
    size_t consumed, max_early_data_size = 0;
    int ret;
    const char *req = "GET / HTTP/1.0\r\n\r\n";
    const char *resp = "HTTP/1.0 200 OK\r\n\r\nhello world\n";

    if (check_ch)
        ctx->verify_certificate = verify_certificate;

    client = ptls_new(ctx, 0);
    server = ptls_new(ctx_peer, 1);
    ptls_buffer_init(&cbuf, cbuf_small, sizeof(cbuf_small));
    ptls_buffer_init(&sbuf, sbuf_small, sizeof(sbuf_small));
    ptls_buffer_init(&decbuf, decbuf_small, sizeof(decbuf_small));

    if (check_ch) {
        static ptls_on_client_hello_t cb = {save_client_hello};
        ctx_peer->on_client_hello = &cb;
        static const ptls_iovec_t protocols[] = {{(uint8_t *)"h2", 2}, {(uint8_t *)"http/1.1", 8}};
        client_hs_prop.client.negotiated_protocols.list = protocols;
        client_hs_prop.client.negotiated_protocols.count = PTLS_ELEMENTSOF(protocols);
        ptls_set_server_name(client, "test.example.com", 0);
    }

    static ptls_on_extension_t cb = {on_extension_cb};
    ctx_peer->on_extension = &cb;

    if (require_client_authentication) {
        ctx_peer->require_client_authentication = 1;
    }

    if (ctx_peer->esni != NULL) {
        was_esni = 0;
        client_hs_prop.client.esni_keys = ptls_iovec_init(ESNIKEYS, sizeof(ESNIKEYS) - 1);
    }

    switch (mode) {
    case TEST_HANDSHAKE_HRR:
        client_hs_prop.client.negotiate_before_key_exchange = 1;
        break;
    case TEST_HANDSHAKE_HRR_STATELESS:
        client_hs_prop.client.negotiate_before_key_exchange = 1;
        server_hs_prop.server.cookie.key = "0123456789abcdef0123456789abcdef0123456789abcdef";
        server_hs_prop.server.retry_uses_cookie = 1;
        break;
    case TEST_HANDSHAKE_EARLY_DATA:
        assert(ctx_peer->max_early_data_size != 0);
        client_hs_prop.client.max_early_data_size = &max_early_data_size;
        break;
    }

    ret = ptls_handshake(client, &cbuf, NULL, NULL, &client_hs_prop);
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ok(cbuf.off != 0);

    switch (mode) {
    case TEST_HANDSHAKE_2RTT:
    case TEST_HANDSHAKE_HRR:
    case TEST_HANDSHAKE_HRR_STATELESS:
        consumed = cbuf.off;
        ret = ptls_handshake(server, &sbuf, cbuf.base, &consumed, &server_hs_prop);
        if (mode == TEST_HANDSHAKE_HRR_STATELESS) {
            ok(ret == PTLS_ERROR_STATELESS_RETRY);
            ptls_free(server);
            server = ptls_new(ctx_peer, 1);
        } else {
            ok(ret == PTLS_ERROR_IN_PROGRESS);
        }
        ok(cbuf.off == consumed);
        ok(sbuf.off != 0);
        cbuf.off = 0;
        consumed = sbuf.off;
        ret = ptls_handshake(client, &cbuf, sbuf.base, &consumed, &client_hs_prop);
        ok(ret == PTLS_ERROR_IN_PROGRESS);
        ok(sbuf.off == consumed);
        ok(cbuf.off != 0);
        sbuf.off = 0;
        break;
    case TEST_HANDSHAKE_EARLY_DATA:
        ok(max_early_data_size == ctx_peer->max_early_data_size);
        ret = ptls_send(client, &cbuf, req, strlen(req));
        ok(ret == 0);
        break;
    }

    consumed = cbuf.off;
    ret = ptls_handshake(server, &sbuf, cbuf.base, &consumed, &server_hs_prop);

    if (require_client_authentication == 1) {
        ok(ptls_is_psk_handshake(server) == 0);
        ok(ret == PTLS_ERROR_IN_PROGRESS);
    } else {
        ok(ret == 0);
    }

    ok(sbuf.off != 0);
    if (check_ch) {
        ok(ptls_get_server_name(server) != NULL);
        ok(strcmp(ptls_get_server_name(server), "test.example.com") == 0);
        ok(ptls_get_negotiated_protocol(server) != NULL);
        ok(strcmp(ptls_get_negotiated_protocol(server), "h2") == 0);
        ok(was_esni == (ctx_peer->esni != NULL));
    } else {
        ok(ptls_get_server_name(server) == NULL);
        ok(ptls_get_negotiated_protocol(server) == NULL);
    }

    if (mode == TEST_HANDSHAKE_EARLY_DATA && require_client_authentication == 0) {
        ok(consumed < cbuf.off);
        memmove(cbuf.base, cbuf.base + consumed, cbuf.off - consumed);
        cbuf.off -= consumed;

        consumed = cbuf.off;
        ret = ptls_receive(server, &decbuf, cbuf.base, &consumed);
        ok(ret == 0);
        ok(consumed == cbuf.off);
        ok(decbuf.off == strlen(req));
        ok(memcmp(decbuf.base, req, decbuf.off) == 0);
        ok(!ptls_handshake_is_complete(server));
        cbuf.off = 0;
        decbuf.off = 0;

        ret = ptls_send(server, &sbuf, resp, strlen(resp));
        ok(ret == 0);
    } else {
        ok(consumed == cbuf.off);
        cbuf.off = 0;
    }

    consumed = sbuf.off;
    ret = ptls_handshake(client, &cbuf, sbuf.base, &consumed, NULL);
    ok(ret == 0);
    ok(cbuf.off != 0);
    if (check_ch) {
        ok(ptls_get_server_name(client) != NULL);
        ok(strcmp(ptls_get_server_name(client), "test.example.com") == 0);
        ok(ptls_get_negotiated_protocol(client) != NULL);
        ok(strcmp(ptls_get_negotiated_protocol(client), "h2") == 0);
    } else {
        ok(ptls_get_server_name(server) == NULL);
        ok(ptls_get_negotiated_protocol(server) == NULL);
    }

    if (expect_ticket) {
        ok(consumed < sbuf.off);
        memmove(sbuf.base, sbuf.base + consumed, sbuf.off - consumed);
        sbuf.off -= consumed;
    } else {
        ok(consumed == sbuf.off);
        sbuf.off = 0;
    }

    if (require_client_authentication == 1) {
        ok(!ptls_handshake_is_complete(server));
        consumed = cbuf.off;
        ret = ptls_handshake(server, &sbuf, cbuf.base, &consumed, &server_hs_prop);
        ok(ret == 0);
        ok(ptls_handshake_is_complete(server));
        cbuf.off = 0;
    }

    if (mode != TEST_HANDSHAKE_EARLY_DATA || require_client_authentication == 1) {
        ret = ptls_send(client, &cbuf, req, strlen(req));
        ok(ret == 0);

        consumed = cbuf.off;
        ret = ptls_receive(server, &decbuf, cbuf.base, &consumed);
        ok(ret == 0);
        ok(consumed == cbuf.off);
        ok(decbuf.off == strlen(req));
        ok(memcmp(decbuf.base, req, strlen(req)) == 0);
        ok(ptls_handshake_is_complete(server));
        decbuf.off = 0;
        cbuf.off = 0;

        ret = ptls_send(server, &sbuf, resp, strlen(resp));
        ok(ret == 0);
    }

    consumed = sbuf.off;
    ret = ptls_receive(client, &decbuf, sbuf.base, &consumed);
    ok(ret == 0);
    ok(consumed == sbuf.off);
    ok(decbuf.off == strlen(resp));
    ok(memcmp(decbuf.base, resp, strlen(resp)) == 0);
    ok(ptls_handshake_is_complete(client));
    decbuf.off = 0;
    sbuf.off = 0;

    if (mode == TEST_HANDSHAKE_EARLY_DATA) {
        consumed = cbuf.off;
        ret = ptls_receive(server, &decbuf, cbuf.base, &consumed);
        ok(ret == 0);
        ok(cbuf.off == consumed);
        ok(decbuf.off == 0);
        ok(ptls_handshake_is_complete(client));
        cbuf.off = 0;
    }

    if (mode == TEST_HANDSHAKE_KEY_UPDATE) {
        /* server -> client with update_request */
        ret = ptls_update_key(server, 1);
        ok(ret == 0);
        ok(server->needs_key_update);
        ok(server->key_update_send_request);
        ret = ptls_send(server, &sbuf, "good bye", 8);
        ok(ret == 0);
        ok(!server->needs_key_update);
        ok(!server->key_update_send_request);
        consumed = sbuf.off;
        ret = ptls_receive(client, &decbuf, sbuf.base, &consumed);
        ok(ret == 0);
        ok(sbuf.off == consumed);
        ok(decbuf.off == 8);
        ok(memcmp(decbuf.base, "good bye", 8) == 0);
        ok(client->needs_key_update);
        ok(!client->key_update_send_request);
        sbuf.off = 0;
        decbuf.off = 0;
        ret = ptls_send(client, &cbuf, "hello", 5);
        ok(ret == 0);
        consumed = cbuf.off;
        ret = ptls_receive(server, &decbuf, cbuf.base, &consumed);
        ok(ret == 0);
        ok(cbuf.off == consumed);
        ok(decbuf.off == 5);
        ok(memcmp(decbuf.base, "hello", 5) == 0);
        cbuf.off = 0;
        decbuf.off = 0;
    }

    ptls_buffer_dispose(&cbuf);
    ptls_buffer_dispose(&sbuf);
    ptls_buffer_dispose(&decbuf);
    ptls_free(client);
    ptls_free(server);

    if (check_ch)
        ctx_peer->on_client_hello = NULL;

    ctx->verify_certificate = NULL;
    if (require_client_authentication)
        ctx_peer->require_client_authentication = 0;
}